

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphcycles.cc
# Opt level: O2

void __thiscall
absl::synchronization_internal::anon_unknown_0::Vec<int>::Grow(Vec<int> *this,uint32_t n)

{
  uint uVar1;
  int *__dest;
  
  uVar1 = this->capacity_;
  while (uVar1 < n) {
    uVar1 = uVar1 * 2;
    this->capacity_ = uVar1;
  }
  __dest = (int *)base_internal::LowLevelAlloc::AllocWithArena
                            ((ulong)uVar1 << 2,(anonymous_namespace)::arena);
  if ((ulong)this->size_ != 0) {
    memmove(__dest,this->ptr_,(ulong)this->size_ << 2);
  }
  Discard(this);
  this->ptr_ = __dest;
  return;
}

Assistant:

void Grow(uint32_t n) {
    while (capacity_ < n) {
      capacity_ *= 2;
    }
    size_t request = static_cast<size_t>(capacity_) * sizeof(T);
    T* copy = static_cast<T*>(
        base_internal::LowLevelAlloc::AllocWithArena(request, arena));
    std::copy(ptr_, ptr_ + size_, copy);
    Discard();
    ptr_ = copy;
  }